

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void check_integral_opt_get<zmq::socket_type,zmq::sockopt::integral_option<16,zmq::socket_type,false>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  MessageBuilder *builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  SourceLineInfo local_e8;
  StringRef local_d8;
  MessageBuilder local_c8;
  undefined1 local_70 [8];
  ScopedMessage scopedMessage19;
  string *info_local;
  socket_t *sock_local;
  
  scopedMessage19._72_8_ = param_2;
  local_d8 = operator____catch_sr("INFO",4);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
             0xf2);
  Catch::MessageBuilder::MessageBuilder(&local_c8,local_d8,&local_e8,Info);
  std::operator+(&local_108,"getting ",param_2);
  builder = Catch::MessageBuilder::operator<<(&local_c8,&local_108);
  Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_70,builder);
  std::__cxx11::string::~string((string *)&local_108);
  Catch::MessageBuilder::~MessageBuilder(&local_c8);
  zmq::detail::socket_base::get<16,zmq::socket_type,false>(param_1);
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_70);
  return;
}

Assistant:

void check_integral_opt_get(Opt opt, zmq::socket_t &sock, std::string info)
{
    INFO("getting " + info);
    (void) sock.get(opt);
}